

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_statemachine(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  _Bool local_49;
  size_t local_40;
  size_t nread;
  pingpong *pp;
  imap_conn *imapc;
  int imapcode;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  imapc._4_4_ = CURLE_OK;
  nread = (size_t)&conn->proto;
  local_40 = 0;
  pp = (pingpong *)nread;
  _imapcode = conn;
  conn_local = (connectdata *)data;
LAB_0015e245:
  if ((int)pp[1].sendbuf.toobig == 4) {
    CVar1 = imap_perform_upgrade_tls((Curl_easy *)conn_local,_imapcode);
    if ((CVar1 != CURLE_OK) || ((int)pp[1].sendbuf.toobig == 4)) {
      return CVar1;
    }
    imapc._4_4_ = CURLE_OK;
  }
  if (*(long *)(nread + 0x10) != 0) {
    CVar1 = Curl_pp_flushsend((Curl_easy *)conn_local,(pingpong *)nread);
    return CVar1;
  }
  do {
    imapc._4_4_ = Curl_pp_readresp((Curl_easy *)conn_local,0,(pingpong *)nread,(int *)&imapc,
                                   &local_40);
    if (imapc._4_4_ != CURLE_OK) {
      return imapc._4_4_;
    }
    if ((int)imapc == -1) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if ((int)imapc == 0) {
      return CURLE_OK;
    }
    switch((int)pp[1].sendbuf.toobig) {
    case 1:
      imapc._4_4_ = imap_state_servergreet_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 2:
      imapc._4_4_ = imap_state_capability_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 3:
      imapc._4_4_ = imap_state_starttls_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      if ((imapc._4_4_ == CURLE_OK) && ((int)pp[1].sendbuf.toobig == 4)) goto LAB_0015e245;
      break;
    case 5:
      imapc._4_4_ = imap_state_auth_resp
                              ((Curl_easy *)conn_local,_imapcode,(int)imapc,
                               (imapstate)pp[1].sendbuf.toobig);
      break;
    case 6:
      imapc._4_4_ = imap_state_login_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 7:
    case 0xd:
      imapc._4_4_ = imap_state_listsearch_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 8:
      imapc._4_4_ = imap_state_select_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 9:
      imapc._4_4_ = imap_state_fetch_resp
                              ((Curl_easy *)conn_local,_imapcode,(int)imapc,
                               (imapstate)pp[1].sendbuf.toobig);
      break;
    case 10:
      imapc._4_4_ = imap_state_fetch_final_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 0xb:
      imapc._4_4_ = imap_state_append_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 0xc:
      imapc._4_4_ = imap_state_append_final_resp
                              ((Curl_easy *)conn_local,(int)imapc,(imapstate)pp[1].sendbuf.toobig);
      break;
    case 0xe:
    default:
      imap_state((Curl_easy *)conn_local,IMAP_STOP);
    }
    local_49 = false;
    if ((imapc._4_4_ == CURLE_OK) && (local_49 = false, (int)pp[1].sendbuf.toobig != 0)) {
      local_49 = Curl_pp_moredata((pingpong *)nread);
    }
    if (local_49 == false) {
      return imapc._4_4_;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
upgrade_tls:
  if(imapc->state == IMAP_UPGRADETLS) {
    result = imap_perform_upgrade_tls(data, conn);
    if(result || (imapc->state == IMAP_UPGRADETLS))
      return result;
  }

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(data, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(data, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(data, imapcode, imapc->state);
      /* During UPGRADETLS, leave the read loop as we need to connect
       * (e.g. TLS handshake) before we continue sending/receiving. */
      if(!result && (imapc->state == IMAP_UPGRADETLS))
        goto upgrade_tls;
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(data, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(data, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
    default:
      /* internal error */
      imap_state(data, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}